

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O0

int __thiscall
IServer::SendPackMsg<CNetMsg_Sv_WeaponPickup>
          (IServer *this,CNetMsg_Sv_WeaponPickup *pMsg,int Flags,int ClientID)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  CNetMsg_Sv_WeaponPickup *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  CMsgPacker Packer;
  undefined4 in_stack_fffffffffffff7a8;
  int in_stack_fffffffffffff7ac;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b4;
  int local_824;
  undefined1 local_820 [2072];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CNetMsg_Sv_WeaponPickup::MsgID(in_RSI);
  CMsgPacker::CMsgPacker
            ((CMsgPacker *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             in_stack_fffffffffffff7ac,SUB41((uint)in_stack_fffffffffffff7a8 >> 0x18,0));
  bVar1 = CNetMsg_Sv_WeaponPickup::Pack
                    ((CNetMsg_Sv_WeaponPickup *)
                     CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                     (CMsgPacker *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  if (bVar1) {
    local_824 = -1;
  }
  else {
    local_824 = (**(code **)(*in_RDI + 0x48))(in_RDI,local_820,in_EDX,in_ECX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_824;
  }
  __stack_chk_fail();
}

Assistant:

int SendPackMsg(T *pMsg, int Flags, int ClientID)
	{
		CMsgPacker Packer(pMsg->MsgID(), false);
		if(pMsg->Pack(&Packer))
			return -1;
		return SendMsg(&Packer, Flags, ClientID);
	}